

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29c88c::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  size_t *psVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  half tmp;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  int j;
  ulong uVar14;
  int i;
  ulong uVar15;
  bool bVar16;
  ushort auStack_58 [20];
  half candidate [16];
  
  sVar11 = this->_endValue;
  psVar4 = this->_offset;
  for (uVar6 = this->_startValue; uVar6 < sVar11; uVar6 = uVar6 + 1) {
    uVar10 = (ulong)((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                     countSetBits(unsigned_short)::numBitsSet)
                                   [(uint)(uVar6 >> 8) & 0xff] +
                    (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                    countSetBits(unsigned_short)::numBitsSet)[(uint)uVar6 & 0xff]);
    psVar4[uVar6 - this->_startValue] = this->_numElements;
    uVar14 = 0;
    uVar8 = uVar10;
    for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
      uVar9 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar9;
      bVar12 = 0;
      for (uVar15 = 0; uVar15 != 0x10000; uVar15 = uVar15 + 1) {
        bVar16 = (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                 countSetBits(unsigned_short)::numBitsSet)[uVar15 >> 8 & 0xffffff] +
                 (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                 countSetBits(unsigned_short)::numBitsSet)[uVar15 & 0xff] == uVar9;
        uVar13 = (uint)uVar14;
        if (bVar16) {
          uVar13 = (uint)uVar15;
        }
        if ((bool)(bVar16 & bVar12)) {
          fVar1 = *(float *)((long)&half::_toFloat + (uVar6 & 0xffff) * 4);
          bVar12 = 1;
          if (ABS(fVar1 - *(float *)((long)&half::_toFloat + uVar15 * 4)) <
              ABS(fVar1 - *(float *)((long)&half::_toFloat + (uVar14 & 0xffff) * 4))) {
            uVar14 = uVar15 & 0xffffffff;
          }
        }
        else {
          bVar12 = bVar12 | bVar16;
          uVar14 = (ulong)uVar13;
        }
      }
      auStack_58[uVar7] = (ushort)uVar14;
    }
    uVar8 = 1;
    for (uVar7 = 0; uVar14 = uVar8, uVar7 != uVar10; uVar7 = uVar7 + 1) {
      for (; uVar14 < uVar10; uVar14 = uVar14 + 1) {
        uVar2 = auStack_58[uVar7];
        uVar3 = auStack_58[uVar14];
        if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar3 >> 8] +
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar3 & 0xff] <
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar2 >> 8] +
            (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::
                            numBitsSet)[uVar2 & 0xff]) {
          auStack_58[uVar7] = uVar3;
          auStack_58[uVar14] = uVar2;
        }
      }
      uVar8 = uVar8 + 1;
    }
    sVar11 = this->_numElements;
    puVar5 = this->_elements;
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      puVar5[sVar11 + uVar8] = auStack_58[uVar8];
      this->_numElements = sVar11 + 1 + uVar8;
    }
    sVar11 = this->_endValue;
    if (uVar6 == sVar11 - 1) {
      this->_lastCandidateCount = uVar10;
    }
  }
  return;
}

Assistant:

void run(bool outputProgress)
    {
        half candidate[16];
        int  candidateCount = 0;

        for (size_t input=_startValue; input<_endValue; ++input) {

            int  numSetBits = countSetBits(input);
            half inputHalf, closestHalf;

            inputHalf.setBits(input);
            closestHalf.setBits(0);

            _offset[input - _startValue] = _numElements;

            // Gather candidates
            candidateCount = 0;
            for (int targetNumSetBits=numSetBits-1; targetNumSetBits>=0;
                 --targetNumSetBits) {
                bool valueFound = false;

                for (int i=0; i<65536; ++i) {
                    if (countSetBits(i) != targetNumSetBits) continue;

                    if (!valueFound) {
                        closestHalf.setBits(i);
                        valueFound = true;
                    } else {
                        half tmpHalf;

                        tmpHalf.setBits(i);

                        if (fabs((float)inputHalf - (float)tmpHalf) < 
                            fabs((float)inputHalf - (float)closestHalf)) {
                            closestHalf = tmpHalf;
                        }
                    }
                }

                candidate[candidateCount] = closestHalf;
                candidateCount++;
            }

            // Sort candidates by increasing number of bits set
            for (int i=0; i<candidateCount; ++i) {
                for (int j=i+1; j<candidateCount; ++j) {

                    int   iCnt = countSetBits(candidate[i].bits());
                    int   jCnt = countSetBits(candidate[j].bits());

                    if (jCnt < iCnt) {
                        half tmp     = candidate[i];
                        candidate[i] = candidate[j];
                        candidate[j] = tmp;
                    }
                }
            }

            // Copy candidates to the data buffer;
            for (int i=0; i<candidateCount; ++i) {
                _elements[_numElements] = candidate[i].bits();
                _numElements++;
            }

            if (input == _endValue-1) {
                _lastCandidateCount = candidateCount;
            }
        }
    }